

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowStorageDeviceType::~IfcFlowStorageDeviceType
          (IfcFlowStorageDeviceType *this)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *puVar3;
  long *plVar4;
  void *pvVar5;
  
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = 0x87a6d8;
  *(undefined8 *)&(this->super_IfcDistributionFlowElementType).field_0x1b0 = 0x87a7a0;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = 0x87a700;
  (this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
  .super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x87a728;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = 0x87a750;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.field_0x148 = 0x87a778;
  puVar3 = *(undefined1 **)
            &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.field_0x158;
  puVar1 = &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
            super_IfcElementType.field_0x168;
  if (puVar3 != puVar1) {
    operator_delete(puVar3,*(long *)puVar1 + 1);
  }
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = 0x87a7c8;
  *(undefined8 *)&(this->super_IfcDistributionFlowElementType).field_0x1b0 = 0x87a868;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = 0x87a7f0;
  (this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
  .super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x87a818;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = 0x87a840;
  plVar4 = (long *)(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
                   super_IfcElementType.super_IfcTypeProduct.Tag.ptr._M_dataplus._M_p;
  paVar2 = &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
            super_IfcElementType.super_IfcTypeProduct.Tag.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar4 != paVar2) {
    operator_delete(plVar4,paVar2->_M_allocated_capacity + 1);
  }
  pvVar5 = *(void **)&(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
                      super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x100;
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,*(long *)&(this->super_IfcDistributionFlowElementType).
                                     super_IfcDistributionElementType.super_IfcElementType.
                                     super_IfcTypeProduct.field_0x110 - (long)pvVar5);
  }
  IfcTypeObject::~IfcTypeObject((IfcTypeObject *)this,&PTR_construction_vtable_24__0087a2b0);
  operator_delete(this,0x1c8);
  return;
}

Assistant:

IfcFlowStorageDeviceType() : Object("IfcFlowStorageDeviceType") {}